

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.cpp
# Opt level: O0

void __thiscall Widget::writeXmlAttributes(Widget *this,stringstream *str)

{
  stringstream *psVar1;
  Transform local_378;
  allocator local_351;
  string local_350 [32];
  Util local_330 [32];
  Util local_310 [39];
  allocator local_2e9;
  string local_2e8 [32];
  Util local_2c8 [39];
  allocator local_2a1;
  string local_2a0 [32];
  Util local_280 [39];
  allocator local_259;
  string local_258 [32];
  Util local_238 [39];
  allocator local_211;
  string local_210 [32];
  Util local_1f0 [39];
  allocator local_1c9;
  string local_1c8 [32];
  Util local_1a8 [39];
  allocator local_181;
  string local_180 [32];
  Util local_160 [32];
  string local_140 [39];
  allocator local_119;
  string local_118 [32];
  Util local_f8 [32];
  string local_d8 [39];
  allocator local_b1;
  string local_b0 [32];
  Util local_90 [55];
  allocator local_59;
  string local_58 [32];
  Util local_38 [32];
  stringstream *local_18;
  stringstream *str_local;
  Widget *this_local;
  
  local_18 = str;
  str_local = (stringstream *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,"type",&local_59);
  Util::writeXmlAttribute<int>(local_38,str,(string *)local_58,this->type);
  std::__cxx11::string::~string((string *)local_38);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  psVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,"styleFile",&local_b1);
  std::__cxx11::string::string(local_d8,(string *)&this->stylefile);
  Util::writeXmlAttribute<std::__cxx11::string>
            (local_90,psVar1,(string *)local_b0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8);
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::~string(local_d8);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  psVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_118,"name",&local_119);
  std::__cxx11::string::string(local_140,(string *)&this->name);
  Util::writeXmlAttribute<std::__cxx11::string>
            (local_f8,psVar1,(string *)local_118,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140);
  std::__cxx11::string::~string((string *)local_f8);
  std::__cxx11::string::~string(local_140);
  std::__cxx11::string::~string(local_118);
  std::allocator<char>::~allocator((allocator<char> *)&local_119);
  psVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_180,"x",&local_181);
  Util::writeXmlAttribute<float>(local_160,psVar1,(string *)local_180,this->x);
  std::__cxx11::string::~string((string *)local_160);
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  psVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1c8,"y",&local_1c9);
  Util::writeXmlAttribute<float>(local_1a8,psVar1,(string *)local_1c8,this->y);
  std::__cxx11::string::~string((string *)local_1a8);
  std::__cxx11::string::~string(local_1c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
  psVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_210,"width",&local_211);
  Util::writeXmlAttribute<float>(local_1f0,psVar1,(string *)local_210,this->width);
  std::__cxx11::string::~string((string *)local_1f0);
  std::__cxx11::string::~string(local_210);
  std::allocator<char>::~allocator((allocator<char> *)&local_211);
  psVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_258,"height",&local_259);
  Util::writeXmlAttribute<float>(local_238,psVar1,(string *)local_258,this->height);
  std::__cxx11::string::~string((string *)local_238);
  std::__cxx11::string::~string(local_258);
  std::allocator<char>::~allocator((allocator<char> *)&local_259);
  psVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2a0,"visible",&local_2a1);
  Util::writeXmlAttribute<bool>(local_280,psVar1,(string *)local_2a0,(bool)(this->visible & 1));
  std::__cxx11::string::~string((string *)local_280);
  std::__cxx11::string::~string(local_2a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
  psVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2e8,"anchor",&local_2e9);
  Util::toString_abi_cxx11_(local_310,this->anchor);
  Util::writeXmlAttribute<std::__cxx11::string>
            (local_2c8,psVar1,(string *)local_2e8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_310);
  std::__cxx11::string::~string((string *)local_2c8);
  std::__cxx11::string::~string((string *)local_310);
  std::__cxx11::string::~string(local_2e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
  psVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_350,"transform",&local_351);
  Transform::writeXmlAttribute_abi_cxx11_(&local_378);
  Util::writeXmlAttribute<std::__cxx11::string>
            (local_330,psVar1,(string *)local_350,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_378);
  std::__cxx11::string::~string((string *)local_330);
  std::__cxx11::string::~string((string *)&local_378);
  std::__cxx11::string::~string(local_350);
  std::allocator<char>::~allocator((allocator<char> *)&local_351);
  return;
}

Assistant:

void Widget::writeXmlAttributes(std::stringstream &str) const
{
	Util::writeXmlAttribute(str, "type", type);
	Util::writeXmlAttribute(str, "styleFile", stylefile);
	Util::writeXmlAttribute(str, "name", name);
	Util::writeXmlAttribute(str, "x", x);
	Util::writeXmlAttribute(str, "y", y);
	Util::writeXmlAttribute(str, "width", width);
	Util::writeXmlAttribute(str, "height", height);
	Util::writeXmlAttribute(str, "visible", visible);
	Util::writeXmlAttribute(str, "anchor", Util::toString(anchor));
	Util::writeXmlAttribute(str, "transform", transform.writeXmlAttribute());
}